

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datamanager.cpp
# Opt level: O0

int DataManager::getNodeType(int index,int *type,Network *nw)

{
  int iVar1;
  Node *pNVar2;
  Network *nw_local;
  int *type_local;
  int index_local;
  
  *type = 0;
  if ((index < 0) || (iVar1 = Network::count(nw,NODE), iVar1 <= index)) {
    type_local._4_4_ = 0xcd;
  }
  else {
    pNVar2 = Network::node(nw,index);
    iVar1 = (*(pNVar2->super_Element)._vptr_Element[2])();
    if (iVar1 == 0) {
      *type = 0;
    }
    else if (iVar1 == 1) {
      *type = 2;
    }
    else if (iVar1 == 2) {
      *type = 1;
    }
    type_local._4_4_ = 0;
  }
  return type_local._4_4_;
}

Assistant:

int DataManager::getNodeType(int index, int* type, Network* nw)
{
    *type = 0;
    if ( index < 0 || index >= nw->count(Element::NODE) ) return 205;
    switch (nw->node(index)->type())
    {
        case Node::JUNCTION:  *type = EN_JUNCTION;  break;
        case Node::RESERVOIR: *type = EN_RESERVOIR; break;
        case Node::TANK:      *type = EN_TANK;      break;
    }
    return 0;
}